

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reducer_impl.cpp
# Opt level: O1

elem * cilkred_map::grow(__cilkrts_worker *w,bucket **bp)

{
  undefined8 *puVar1;
  undefined8 *puVar2;
  bucket *pbVar3;
  undefined8 uVar4;
  bucket *pbVar5;
  long lVar6;
  elem *peVar7;
  size_t sVar8;
  size_t sVar9;
  ulong uVar10;
  ulong uVar11;
  
  pbVar3 = *bp;
  if (pbVar3 == (bucket *)0x0) {
    sVar9 = 0;
  }
  else {
    sVar9 = pbVar3->nmax;
    if (sVar9 != 0) {
      peVar7 = pbVar3->el;
      sVar8 = sVar9;
      do {
        if (peVar7->key == (void *)0x0) {
          return peVar7;
        }
        peVar7 = peVar7 + 1;
        sVar8 = sVar8 - 1;
      } while (sVar8 != 0);
    }
  }
  sVar8 = __cilkrts_frame_malloc_roundup(sVar9 * 0x30 + 0x20);
  uVar11 = (sVar8 - 0x20) / 0x18;
  pbVar5 = (bucket *)__cilkrts_frame_malloc(w,uVar11 * 0x18 + 0x20);
  pbVar5->nmax = uVar11;
  if (sVar9 == 0) {
    uVar10 = 0;
  }
  else {
    lVar6 = 8;
    sVar8 = sVar9;
    do {
      *(undefined8 *)((long)&pbVar5->el[0].hb + lVar6) =
           *(undefined8 *)((long)&pbVar3->el[0].hb + lVar6);
      puVar1 = (undefined8 *)((long)pbVar3->el + lVar6 + -8);
      uVar4 = puVar1[1];
      puVar2 = (undefined8 *)((long)pbVar5->el + lVar6 + -8);
      *puVar2 = *puVar1;
      puVar2[1] = uVar4;
      lVar6 = lVar6 + 0x18;
      sVar8 = sVar8 - 1;
      uVar10 = sVar9;
    } while (sVar8 != 0);
  }
  pbVar3 = *bp;
  if (pbVar3 != (bucket *)0x0) {
    __cilkrts_frame_free(w,pbVar3,pbVar3->nmax * 0x18 + 0x20);
    *bp = (bucket *)0x0;
  }
  *bp = pbVar5;
  if (uVar10 < uVar11) {
    peVar7 = pbVar5->el + sVar9;
    do {
      peVar7->key = (void *)0x0;
      uVar10 = uVar10 + 1;
      peVar7 = peVar7 + 1;
    } while (uVar11 != uVar10);
  }
  pbVar5->el[uVar10].key = (void *)0x0;
  return pbVar5->el + sVar9;
}

Assistant:

elem *cilkred_map::grow(__cilkrts_worker *w, 
                        bucket          **bp)
{
    size_t i, nmax, nnmax;
    bucket *b, *nb;

    b = *bp;
    if (b) {
        nmax = b->nmax;
        /* find empty element if any */
        for (i = 0; i < nmax; ++i) 
            if (b->el[i].key == 0) 
                return &(b->el[i]);
        /* do not use the last one even if empty */
    } else {
        nmax = 0;
    }

    verify_current_wkr(w);
    /* allocate a new bucket */
    nnmax = roundup(2 * nmax);
    nb = alloc_bucket(w, nnmax);


    /* copy old bucket into new */
    for (i = 0; i < nmax; ++i)
        nb->el[i] = b->el[i];
     
    free_bucket(w, bp); *bp = nb;

    /* zero out extra elements */
    for (; i < nnmax; ++i)
        nb->el[i].key = 0;

    /* zero out the last one */
    nb->el[i].key = 0;
  
    return &(nb->el[nmax]);
}